

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  uint uVar4;
  uchar *puVar5;
  ImFont *pIVar6;
  uchar *puVar7;
  ushort *puVar8;
  uint uVar9;
  ushort *puVar10;
  ulong uVar11;
  uint uVar12;
  undefined7 local_170;
  float fStack_169;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  ImWchar *pIStack_130;
  float local_128;
  char local_118 [46];
  undefined2 uStack_ea;
  undefined6 uStack_e8;
  ImFontConfig local_d8;
  float local_48;
  
  uVar4 = *(uint *)((long)compressed_ttf_data + 8);
  uVar12 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  local_48 = size_pixels;
  puVar5 = (uchar *)ImGui::MemAlloc((ulong)uVar12);
  uVar4 = *compressed_ttf_data;
  if (((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) ==
       0x57bc0000) &&
     (uVar4 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar4 >> 0x18 == 0 && (uVar4 & 0xff0000) == 0) && (uVar4 & 0xff00) == 0) &&
     (uVar4 & 0xff) == 0)) {
    uVar4 = *(uint *)((long)compressed_ttf_data + 8);
    puVar10 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e =
         puVar5 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
    stb__barrier_out_b = puVar5;
    stb__dout = puVar5;
    do {
      bVar3 = (byte)*puVar10;
      uVar9 = (uint)bVar3;
      if (bVar3 < 0x20) {
        if (bVar3 < 0x18) {
          if (bVar3 < 0x10) {
            if (bVar3 < 8) {
              if (bVar3 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar10 + 3) |
                             (ulong)*(byte *)((long)puVar10 + 1) << 0x10 |
                            (ulong)(byte)puVar10[1] << 8),
                           (ushort)(puVar10[2] << 8 | puVar10[2] >> 8) + 1);
                puVar8 = puVar10 + 3;
              }
              else {
                if (uVar9 == 6) {
                  uVar11 = ~((ulong)*(byte *)((long)puVar10 + 3) |
                             (ulong)*(byte *)((long)puVar10 + 1) << 0x10 |
                            (ulong)(byte)puVar10[1] << 8);
                  uVar9 = (uint)(byte)puVar10[2];
                  goto LAB_001a542f;
                }
                puVar8 = puVar10;
                if (uVar9 == 7) {
                  uVar11 = (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                          *(ushort *)((long)puVar10 + 1) >> 8);
                  puVar7 = stb__dout + uVar11 + 1;
                  if (puVar7 <= stb__barrier_out_e) {
                    if ((byte *)((long)puVar10 + 3) < stb__barrier_in_b) {
                      puVar7 = stb__barrier_out_e + 1;
                    }
                    else {
                      memcpy(stb__dout,(byte *)((long)puVar10 + 3),uVar11 + 1);
                    }
                  }
                  puVar8 = (ushort *)
                           ((long)puVar10 +
                           (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                          *(ushort *)((long)puVar10 + 1) >> 8) + 4);
                  stb__dout = puVar7;
                }
              }
            }
            else {
              uVar11 = (ulong)(((uint)bVar3 * 0x100 + (uint)*(byte *)((long)puVar10 + 1)) - 0x7ff);
              puVar7 = stb__dout + uVar11;
              if (puVar7 <= stb__barrier_out_e) {
                if (puVar10 + 1 < stb__barrier_in_b) {
                  puVar7 = stb__barrier_out_e + 1;
                }
                else {
                  memcpy(stb__dout,puVar10 + 1,uVar11);
                }
              }
              puVar8 = (ushort *)
                       ((long)puVar10 + ((ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8) - 0x7fd));
              stb__dout = puVar7;
            }
          }
          else {
            uVar11 = -(ulong)(((uint)*(byte *)((long)puVar10 + 1) * 0x100 +
                              ((uint)(byte)puVar10[1] | (uint)bVar3 << 0x10)) - 0xfffff);
            uVar9 = (uint)(ushort)(*(ushort *)((long)puVar10 + 3) << 8 |
                                  *(ushort *)((long)puVar10 + 3) >> 8);
LAB_001a542f:
            stb__match(stb__dout + uVar11,uVar9 + 1);
            puVar8 = (ushort *)((long)puVar10 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar10 + 1) * 0x100 +
                              ((uint)(byte)puVar10[1] | (uint)bVar3 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar10 + 3) + 1);
          puVar8 = puVar10 + 2;
        }
      }
      else if ((char)bVar3 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar10 + 1),uVar9 - 0x7f);
        puVar8 = puVar10 + 1;
      }
      else if (bVar3 < 0x40) {
        puVar7 = stb__dout + (uVar9 - 0x1f);
        if (puVar7 <= stb__barrier_out_e) {
          if ((byte *)((long)puVar10 + 1) < stb__barrier_in_b) {
            puVar7 = stb__barrier_out_e + 1;
          }
          else {
            memcpy(stb__dout,(byte *)((long)puVar10 + 1),(ulong)(uVar9 - 0x1f));
          }
        }
        puVar8 = (ushort *)((long)puVar10 + ((ulong)(byte)*puVar10 - 0x1e));
        stb__dout = puVar7;
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar10 + 1) + (uint)bVar3 * 0x100) - 0x3fff),
                   (byte)puVar10[1] + 1);
        puVar8 = (ushort *)((long)puVar10 + 3);
      }
    } while ((puVar8 != puVar10) &&
            (puVar10 = puVar8,
            stb__dout <=
            puVar5 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18)));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_d8.MergeMode = false;
    local_d8._73_3_ = 0;
    local_d8.FontBuilderFlags = 0;
    local_170._0_3_ = 0;
    local_170._3_4_ = 0;
    fStack_169 = 0.0;
    local_148._0_1_ = false;
    local_148._1_3_ = 0;
    local_148._4_4_ = 0.0;
    uStack_140._0_4_ = 0.0;
    uStack_140._4_4_ = 0.0;
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0;
    pIStack_130 = (ImWchar *)0x0;
    local_128 = 0.0;
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = '\0';
    local_118[9] = '\0';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    local_118[0x18] = '\0';
    local_118[0x19] = '\0';
    local_118[0x1a] = '\0';
    local_118[0x1b] = '\0';
    local_118[0x1c] = '\0';
    local_118[0x1d] = '\0';
    local_118[0x1e] = '\0';
    local_118[0x1f] = '\0';
    local_118[0x20] = '\0';
    local_118[0x21] = '\0';
    local_118[0x22] = '\0';
    local_118[0x23] = '\0';
    local_118[0x24] = '\0';
    local_118[0x25] = '\0';
    local_118[0x26] = '\0';
    local_118[0x27] = '\0';
    local_118[0x28] = 0;
    local_118[0x29] = 0;
    local_118[0x2a] = 0;
    local_118[0x2b] = 0;
    local_118[0x2c] = 0;
    local_118[0x2d] = 0;
    uStack_ea = 0;
    uStack_e8 = 0;
    local_d8.OversampleH = 2;
    local_d8.OversampleV = 1;
    fVar1 = 1.0;
    fVar2 = 1.0;
    local_d8.EllipsisChar = 0xffff;
    local_d8.GlyphMaxAdvanceX = 3.4028235e+38;
  }
  else {
    local_170 = (undefined7)*(undefined8 *)&font_cfg_template->field_0xd;
    fStack_169 = font_cfg_template->SizePixels;
    local_d8.OversampleH = font_cfg_template->OversampleH;
    local_d8.OversampleV = font_cfg_template->OversampleV;
    local_148._0_1_ = font_cfg_template->PixelSnapH;
    local_148._1_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_148._4_4_ = (font_cfg_template->GlyphExtraSpacing).x;
    uStack_140 = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_138 = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    pIStack_130 = font_cfg_template->GlyphRanges;
    local_128 = font_cfg_template->GlyphMinAdvanceX;
    local_d8.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_d8.MergeMode = font_cfg_template->MergeMode;
    local_d8._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_d8.FontBuilderFlags = font_cfg_template->FontBuilderFlags;
    fVar1 = font_cfg_template->RasterizerMultiply;
    fVar2 = font_cfg_template->RasterizerDensity;
    local_d8.EllipsisChar = font_cfg_template->EllipsisChar;
    uStack_e8 = (undefined6)((ulong)font_cfg_template->DstFont >> 0x10);
    local_118._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_118._40_6_ = (undefined6)*(undefined8 *)&font_cfg_template->field_0x82;
    uStack_ea = (undefined2)((ulong)*(undefined8 *)&font_cfg_template->field_0x82 >> 0x30);
    local_118._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_118._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_118._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_118._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
  }
  local_d8.FontDataOwnedByAtlas = true;
  local_d8._13_3_ = (undefined3)local_170;
  local_d8.FontNo = local_170._3_4_;
  local_d8.PixelSnapH = local_148._0_1_;
  local_d8._33_3_ = local_148._1_3_;
  local_d8.GlyphExtraSpacing.x = local_148._4_4_;
  local_d8.GlyphExtraSpacing.y = (float)uStack_140;
  local_d8.GlyphOffset.x = uStack_140._4_4_;
  local_d8.GlyphOffset.y = (float)local_138;
  local_d8._52_4_ = local_138._4_4_;
  local_d8.GlyphRanges = pIStack_130;
  local_d8.GlyphMinAdvanceX = local_128;
  local_d8.RasterizerDensity = fVar2;
  local_d8.RasterizerMultiply = fVar1;
  local_d8.DstFont._2_6_ = uStack_e8;
  local_d8.Name[0x20] = local_118[0x20];
  local_d8.Name[0x21] = local_118[0x21];
  local_d8.Name[0x22] = local_118[0x22];
  local_d8.Name[0x23] = local_118[0x23];
  local_d8.Name[0x24] = local_118[0x24];
  local_d8.Name[0x25] = local_118[0x25];
  local_d8.Name[0x26] = local_118[0x26];
  local_d8.Name[0x27] = local_118[0x27];
  local_d8._130_1_ = local_118[0x28];
  local_d8._131_1_ = local_118[0x29];
  local_d8._132_1_ = local_118[0x2a];
  local_d8._133_1_ = local_118[0x2b];
  local_d8._134_1_ = local_118[0x2c];
  local_d8._135_1_ = local_118[0x2d];
  local_d8.DstFont._0_2_ = uStack_ea;
  local_d8.Name[0x10] = local_118[0x10];
  local_d8.Name[0x11] = local_118[0x11];
  local_d8.Name[0x12] = local_118[0x12];
  local_d8.Name[0x13] = local_118[0x13];
  local_d8.Name[0x14] = local_118[0x14];
  local_d8.Name[0x15] = local_118[0x15];
  local_d8.Name[0x16] = local_118[0x16];
  local_d8.Name[0x17] = local_118[0x17];
  local_d8.Name[0x18] = local_118[0x18];
  local_d8.Name[0x19] = local_118[0x19];
  local_d8.Name[0x1a] = local_118[0x1a];
  local_d8.Name[0x1b] = local_118[0x1b];
  local_d8.Name[0x1c] = local_118[0x1c];
  local_d8.Name[0x1d] = local_118[0x1d];
  local_d8.Name[0x1e] = local_118[0x1e];
  local_d8.Name[0x1f] = local_118[0x1f];
  local_d8.Name[0] = local_118[0];
  local_d8.Name[1] = local_118[1];
  local_d8.Name[2] = local_118[2];
  local_d8.Name[3] = local_118[3];
  local_d8.Name[4] = local_118[4];
  local_d8.Name[5] = local_118[5];
  local_d8.Name[6] = local_118[6];
  local_d8.Name[7] = local_118[7];
  local_d8.Name[8] = local_118[8];
  local_d8.Name[9] = local_118[9];
  local_d8.Name[10] = local_118[10];
  local_d8.Name[0xb] = local_118[0xb];
  local_d8.Name[0xc] = local_118[0xc];
  local_d8.Name[0xd] = local_118[0xd];
  local_d8.Name[0xe] = local_118[0xe];
  local_d8.Name[0xf] = local_118[0xf];
  local_d8.SizePixels =
       (float)(~-(uint)(0.0 < local_48) & (uint)fStack_169 |
              (uint)local_48 & -(uint)(0.0 < local_48));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_d8.GlyphRanges = glyph_ranges;
  }
  local_d8.FontData = puVar5;
  local_d8.FontDataSize = uVar12;
  pIVar6 = AddFont(this,&local_d8);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}